

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O0

void __thiscall RasterizerA2::_renderImpl<CompositorSIMD,false>(RasterizerA2 *this,uint32_t argb32)

{
  int iVar1;
  size_t sVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Cell *pCVar19;
  Cell *pCVar20;
  int32_t iVar21;
  longlong lVar22;
  longlong lVar23;
  undefined4 uVar24;
  int iVar25;
  bool bVar26;
  intptr_t iVar27;
  uchar *puVar28;
  int *piVar29;
  ulong uVar30;
  ushort uVar31;
  int iVar37;
  ushort uVar38;
  ulong uVar32;
  ushort uVar35;
  ushort uVar36;
  int iVar39;
  undefined1 auVar33 [16];
  int iVar41;
  ulong uVar40;
  undefined1 auVar34 [16];
  longlong local_c08;
  longlong lStack_c00;
  undefined4 local_bd8;
  int local_bd4;
  int cover;
  int local_bcc;
  int x1;
  int x0;
  Cell *cell;
  uint32_t *dstPix;
  CompositorSIMD compositor;
  uint8_t *dstLine;
  intptr_t stride;
  size_t y1;
  size_t y0;
  uint32_t argb32_local;
  RasterizerA2 *this_local;
  undefined8 uStack_b60;
  uint32_t local_b4c;
  uint32_t **local_b48;
  RasterizerA2 **local_b40;
  uint32_t local_b34;
  uint32_t **local_b30;
  undefined1 local_b28 [16];
  uint32_t local_b0c;
  undefined1 local_b08 [16];
  undefined8 uStack_af8;
  I128 t0_1;
  I128 s0_1;
  I128 m0_1;
  I128 t1;
  I128 t0;
  I128 s1;
  I128 s0;
  I128 m1;
  I128 m0;
  ulong local_a60;
  size_t i;
  I128 coverXmm;
  ulong local_a30;
  ulong local_9c8;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  longlong *local_750;
  undefined1 *local_748;
  longlong *local_740;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  longlong *local_720;
  undefined1 *local_718;
  longlong *local_710;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  longlong *local_6f8;
  undefined1 *local_6f0;
  longlong *local_6e8;
  longlong *local_6e0;
  longlong *local_6d8;
  longlong *local_6d0;
  longlong *local_6c8;
  int32_t *local_6c0;
  undefined1 local_6b8 [16];
  uint local_6a4;
  int32_t *local_6a0;
  undefined1 local_698 [16];
  uint local_684;
  Cell *local_680;
  undefined1 local_678 [16];
  uint local_664;
  longlong *local_660;
  longlong *local_658;
  int32_t *local_650;
  size_t *local_648;
  Cell *local_640;
  Cell *local_638;
  int32_t *local_630;
  longlong local_628;
  int iStack_620;
  uint uStack_61c;
  undefined4 local_618;
  int32_t iStack_614;
  int iStack_610;
  int iStack_60c;
  longlong local_608;
  longlong lStack_600;
  longlong local_5f8;
  longlong lStack_5f0;
  longlong local_5e8;
  longlong lStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  long local_5c8;
  ulong uStack_5c0;
  longlong local_5b8;
  longlong lStack_5b0;
  undefined8 local_5a8;
  longlong lStack_5a0;
  longlong local_598;
  longlong lStack_590;
  longlong local_588;
  longlong lStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  longlong lStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  Cell *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  Cell *local_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  int32_t *local_4d8;
  undefined4 local_4cc;
  undefined8 local_4c8;
  longlong lStack_4c0;
  undefined4 local_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  longlong local_498;
  longlong lStack_490;
  size_t local_488;
  longlong lStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  longlong local_458;
  longlong lStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  ulong uStack_410;
  ulong local_408;
  ulong uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  longlong local_398;
  longlong lStack_390;
  longlong local_388;
  longlong lStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  longlong local_368;
  undefined8 uStack_360;
  longlong local_358;
  longlong lStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  longlong local_338;
  longlong lStack_330;
  longlong local_328;
  longlong lStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  longlong local_288;
  longlong lStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  longlong local_268;
  longlong lStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  longlong local_248;
  longlong lStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  longlong local_228;
  longlong lStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  longlong local_208;
  longlong lStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  longlong local_1e8;
  longlong lStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  longlong local_1a8;
  longlong lStack_1a0;
  undefined8 local_198;
  longlong lStack_190;
  longlong local_188;
  longlong lStack_180;
  undefined1 *local_178;
  short *local_170;
  undefined1 *local_168;
  short *local_160;
  undefined1 *local_158;
  short *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  size_t local_a8;
  longlong lStack_a0;
  size_t local_98;
  longlong lStack_90;
  longlong local_88;
  longlong lStack_80;
  longlong local_78;
  longlong lStack_70;
  undefined1 *local_68;
  longlong *local_60;
  undefined1 *local_58;
  longlong *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  longlong local_38;
  longlong lStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  longlong local_18;
  longlong lStack_10;
  
  y1 = (size_t)(this->_yBounds).start;
  iVar1 = (this->_yBounds).end;
  iVar27 = Image::stride((this->super_CellRasterizer).super_Rasterizer._dst);
  puVar28 = Image::data<unsigned_char>((this->super_CellRasterizer).super_Rasterizer._dst);
  compositor._u32[1] = (longlong)(puVar28 + y1 * iVar27);
  local_b4c = argb32;
  local_b48 = &dstPix;
  local_b34 = PixelUtils::premultiply(argb32);
  local_b28._4_4_ = 0;
  local_b28._0_4_ = local_b34;
  this_local = (RasterizerA2 *)local_b28._0_8_;
  uStack_b60 = 0;
  local_b40 = &this_local;
  local_b08._8_4_ = local_b34;
  local_b08._0_8_ = CONCAT44(local_b34,local_b34);
  local_b08._12_4_ = local_b34;
  auVar33 = pmovzxbw(local_b08,CONCAT44(local_b34,local_b34));
  local_c08 = auVar33._0_8_;
  lStack_c00 = auVar33._8_8_;
  compositor._p32[1] = local_c08;
  compositor._u32[0] = lStack_c00;
  local_b30 = &dstPix;
  local_b28 = ZEXT416(local_b34);
  local_b0c = local_b34;
  dstPix._0_4_ = local_b34;
  dstPix._4_4_ = local_b34;
  compositor._p32[0]._0_4_ = local_b34;
  compositor._p32[0]._4_4_ = local_b34;
  for (; y1 <= (ulong)(long)iVar1; y1 = y1 + 1) {
    cell = (Cell *)compositor._u32[1];
    _x1 = this->_cells + y1 * this->_cellStride;
    bVar26 = Bounds::empty(this->_xBounds + y1);
    if (!bVar26) {
      local_bcc = this->_xBounds[y1].start;
      local_bd4 = this->_xBounds[y1].end + 1;
      piVar29 = std::min<int>(&local_bd4,&(this->super_CellRasterizer).super_Rasterizer._width);
      cover = *piVar29;
      Bounds::reset(this->_xBounds + y1);
      pCVar20 = cell;
      pCVar19 = _x1;
      local_bd8 = 0;
      local_a30 = (ulong)local_bcc;
      uVar30 = (ulong)cover;
      coverXmm[1] = (longlong)&local_bd8;
      i = 0;
      coverXmm[0] = 0;
      local_a60 = uVar30 - local_a30 >> 2;
      if (local_a60 != 0) {
        i = 0;
        coverXmm[0] = 0;
        for (; auVar33 = stack0xfffffffffffff578, local_a60 != 0; local_a60 = local_a60 - 1) {
          local_640 = _x1 + local_a30;
          local_638 = _x1 + local_a30 + 2;
          m1[1]._4_4_ = (*local_640).area;
          m0[0]._4_4_ = local_640[1].area;
          iVar25 = m0[0]._4_4_;
          m0[0] = CONCAT44(m0[0]._4_4_,m1[1]._4_4_);
          t1[1]._0_4_ = (*local_638).cover;
          t1[1]._4_4_ = (*local_638).area;
          iVar21 = t1[1]._4_4_;
          t0[0]._0_4_ = local_638[1].cover;
          iVar41 = (int)t0[0];
          t0[0]._4_4_ = local_638[1].area;
          t1[1] = CONCAT44((int)t0[0],(int)t1[1]);
          t0[0] = CONCAT44(t0[0]._4_4_,iVar21);
          iStack_60c = m0[0]._4_4_;
          local_628 = t1[1];
          uStack_61c = t0[0]._4_4_;
          _local_618 = CONCAT44(local_640[1].cover,(uint)t0[1]);
          lVar23 = s0[1];
          m1[0]._0_4_ = iStack_610;
          m1[0]._4_4_ = m0[0]._4_4_;
          m1[1] = CONCAT44(t0[0]._4_4_,iStack_620);
          local_5f8 = m1[1];
          lStack_5f0 = m0[0];
          local_608 = t1[1];
          lStack_600 = t0[0];
          local_5c8 = m1[1] << 0x20;
          uStack_5c0 = t1[1] << 0x20 | (ulong)t0[0]._4_4_;
          local_5b8 = m1[1];
          lStack_5b0 = t1[1];
          iVar37 = t0[0]._4_4_ + iStack_620;
          m1[1] = CONCAT44(iVar37,iStack_620);
          m0[0] = CONCAT44(iVar41 + (int)t1[1],(int)t1[1] + t0[0]._4_4_);
          local_538 = 0;
          uStack_530 = 0;
          local_510 = _x1 + local_a30;
          local_528 = 0;
          uStack_520 = 0;
          local_510->cover = 0;
          local_510->area = 0;
          local_510[1].cover = 0;
          local_510[1].area = 0;
          local_4f0 = _x1 + local_a30 + 2;
          local_508 = 0;
          uStack_500 = 0;
          local_4f0->cover = 0;
          local_4f0->area = 0;
          local_4f0[1].cover = 0;
          local_4f0[1].area = 0;
          local_5d8 = 0;
          uStack_5d0 = 0;
          local_5e8 = m1[1];
          lStack_5e0 = m0[0];
          lStack_4c0 = m1[0];
          local_4cc = 9;
          local_4c8._0_4_ = auVar33._0_4_;
          local_4c8._4_4_ = auVar33._4_4_;
          auVar33 = ZEXT416(9);
          s0[1] = CONCAT44(local_4c8._4_4_ >> auVar33,(int)local_4c8 >> auVar33);
          m1[0]._0_4_ = iStack_610 >> auVar33;
          m1[0]._4_4_ = iVar25 >> auVar33;
          local_598 = m1[1];
          lStack_590 = m0[0];
          local_5a8 = 0;
          lStack_5a0 = m1[1];
          iVar39 = (int)t1[1] + t0[0]._4_4_ + iStack_620;
          iVar41 = iVar41 + (int)t1[1] + iVar37;
          m1[1] = CONCAT44(iVar37,iStack_620);
          m0[0] = CONCAT44(iVar41,iVar39);
          sVar2 = i;
          lVar3 = coverXmm[0];
          local_588 = m1[1];
          lStack_580 = m0[0];
          local_578._0_4_ = (int)i;
          local_578._4_4_ = (int)(i >> 0x20);
          uStack_570._0_4_ = (int)coverXmm[0];
          uStack_570._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
          uStack_570._0_4_ = (int)uStack_570 + iVar39;
          uStack_570._4_4_ = uStack_570._4_4_ + iVar41;
          i = CONCAT44(local_578._4_4_ + iVar37,(int)local_578 + iStack_620);
          coverXmm[0] = CONCAT44(uStack_570._4_4_,(int)uStack_570);
          local_488 = i;
          lStack_480 = coverXmm[0];
          local_498 = s0[1];
          lStack_490 = m1[0];
          s0[1] = CONCAT44((local_578._4_4_ + iVar37) - (local_4c8._4_4_ >> auVar33),
                           ((int)local_578 + iStack_620) - ((int)local_4c8 >> auVar33));
          m1[0]._0_4_ = (int)uStack_570 - (iStack_610 >> auVar33);
          m1[0]._4_4_ = uStack_570._4_4_ - (iVar25 >> auVar33);
          local_60 = s0 + 1;
          local_68 = CompositorSIMD::
                     vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::
                     u32_01FF_128;
          local_18 = s0[1];
          lStack_10 = m1[0];
          local_28 = 0x1ff000001ff;
          uStack_20 = 0x1ff000001ff;
          local_418 = s0[1] & 0x1ff000001ff;
          uStack_410 = m1[0] & 0x1ff000001ff;
          m1[0] = uStack_410;
          s0[1] = local_418;
          auVar33 = packssdw(stack0xfffffffffffff578,stack0xfffffffffffff578);
          local_468 = 0x1ff01ff01ff01ff;
          uStack_460 = 0x1ff01ff01ff01ff;
          s0[1] = auVar33._0_8_;
          lVar4 = s0[1];
          m1[0] = auVar33._8_8_;
          lVar5 = m1[0];
          local_478._0_4_ = auVar33._0_4_;
          local_478._4_4_ = auVar33._4_4_;
          uStack_470._0_4_ = auVar33._8_4_;
          uStack_470._4_4_ = auVar33._12_4_;
          local_478._0_4_ = 0x1ff01ff - (int)local_478;
          local_478._4_4_ = 0x1ff01ff - local_478._4_4_;
          uStack_470._0_4_ = 0x1ff01ff - (int)uStack_470;
          uStack_470._4_4_ = 0x1ff01ff - uStack_470._4_4_;
          m1[1] = CONCAT44(local_478._4_4_,(int)local_478);
          m0[0] = CONCAT44(uStack_470._4_4_,(int)uStack_470);
          lVar6 = m1[1];
          lVar7 = m0[0];
          local_3c8._0_2_ = (short)(int)local_478;
          local_3c8._2_2_ = (short)((uint)(int)local_478 >> 0x10);
          local_3c8._4_2_ = (short)local_478._4_4_;
          local_3c8._6_2_ = (short)((uint)local_478._4_4_ >> 0x10);
          uStack_3c0._0_2_ = (short)(int)uStack_470;
          uStack_3c0._2_2_ = (short)((uint)(int)uStack_470 >> 0x10);
          uStack_3c0._4_2_ = (short)uStack_470._4_4_;
          uStack_3c0._6_2_ = (short)((uint)uStack_470._4_4_ >> 0x10);
          local_3d8._0_2_ = auVar33._0_2_;
          local_3d8._2_2_ = auVar33._2_2_;
          local_3d8._4_2_ = auVar33._4_2_;
          local_3d8._6_2_ = auVar33._6_2_;
          uStack_3d0._0_2_ = auVar33._8_2_;
          uStack_3d0._2_2_ = auVar33._10_2_;
          uStack_3d0._4_2_ = auVar33._12_2_;
          uStack_3d0._6_2_ = auVar33._14_2_;
          uVar31 = (ushort)((short)local_3d8 < (short)local_3c8) * (short)local_3d8 |
                   (ushort)((short)local_3d8 >= (short)local_3c8) * (short)local_3c8;
          uVar35 = (ushort)(local_3d8._2_2_ < local_3c8._2_2_) * local_3d8._2_2_ |
                   (ushort)(local_3d8._2_2_ >= local_3c8._2_2_) * local_3c8._2_2_;
          uVar36 = (ushort)(local_3d8._4_2_ < local_3c8._4_2_) * local_3d8._4_2_ |
                   (ushort)(local_3d8._4_2_ >= local_3c8._4_2_) * local_3c8._4_2_;
          uVar38 = (ushort)(local_3d8._6_2_ < local_3c8._6_2_) * local_3d8._6_2_ |
                   (ushort)(local_3d8._6_2_ >= local_3c8._6_2_) * local_3c8._6_2_;
          m1[1]._0_4_ = CONCAT22(uVar35,uVar31);
          m1[1]._0_6_ = CONCAT24(uVar36,(undefined4)m1[1]);
          m1[1] = CONCAT26(uVar38,(undefined6)m1[1]);
          m0[0]._0_4_ = CONCAT22((ushort)(uStack_3d0._2_2_ < uStack_3c0._2_2_) * uStack_3d0._2_2_ |
                                 (ushort)(uStack_3d0._2_2_ >= uStack_3c0._2_2_) * uStack_3c0._2_2_,
                                 (ushort)((short)uStack_3d0 < (short)uStack_3c0) * (short)uStack_3d0
                                 | (ushort)((short)uStack_3d0 >= (short)uStack_3c0) *
                                   (short)uStack_3c0);
          m0[0]._0_6_ = CONCAT24((ushort)(uStack_3d0._4_2_ < uStack_3c0._4_2_) * uStack_3d0._4_2_ |
                                 (ushort)(uStack_3d0._4_2_ >= uStack_3c0._4_2_) * uStack_3c0._4_2_,
                                 (undefined4)m0[0]);
          m0[0] = CONCAT26((ushort)(uStack_3d0._6_2_ < uStack_3c0._6_2_) * uStack_3d0._6_2_ |
                           (ushort)(uStack_3d0._6_2_ >= uStack_3c0._6_2_) * uStack_3c0._6_2_,
                           (undefined6)m0[0]);
          local_388 = m1[1];
          lStack_380 = m0[0];
          local_398 = m1[1];
          lStack_390 = m0[0];
          m1[1]._2_2_ = uVar31;
          m1[1]._0_2_ = uVar31;
          m1[1]._0_6_ = CONCAT24(uVar35,(undefined4)m1[1]);
          m1[1] = CONCAT26(uVar35,(undefined6)m1[1]);
          m0[0]._2_2_ = uVar36;
          m0[0]._0_2_ = uVar36;
          m0[0]._0_6_ = CONCAT24(uVar38,(undefined4)m0[0]);
          m0[0] = CONCAT26(uVar38,(undefined6)m0[0]);
          i = CONCAT44(uStack_570._4_4_,uStack_570._4_4_);
          coverXmm[0] = CONCAT44(uStack_570._4_4_,uStack_570._4_4_);
          s0[1] = CONCAT44((undefined4)m0[0],(undefined4)m0[0]);
          local_338 = s0[1];
          m1[0]._0_4_ = m0[0]._4_4_;
          m1[0]._4_4_ = m0[0]._4_4_;
          uVar24 = m1[1]._4_4_;
          m1[1] = CONCAT44((undefined4)m1[1],(undefined4)m1[1]);
          m0[0] = CONCAT44(uVar24,uVar24);
          local_630 = &cell->cover + local_a30;
          auVar33 = *(undefined1 (*) [16])local_630;
          s1[1] = auVar33._0_8_;
          local_368 = s1[1];
          s0[0] = auVar33._8_8_;
          lVar8 = s0[0];
          local_548 = 0;
          uStack_540 = 0;
          local_378 = 0;
          uStack_370 = 0;
          uStack_360._0_1_ = auVar33[8];
          uStack_360._1_1_ = auVar33[9];
          uStack_360._2_1_ = auVar33[10];
          uStack_360._3_1_ = auVar33[0xb];
          uStack_360._4_1_ = auVar33[0xc];
          uStack_360._5_1_ = auVar33[0xd];
          uStack_360._6_1_ = auVar33[0xe];
          uStack_360._7_1_ = auVar33[0xf];
          t0[1]._1_1_ = 0;
          t0[1]._0_1_ = (byte)uStack_360;
          t0[1]._0_4_ = CONCAT13(0,CONCAT12(uStack_360._1_1_,(ushort)t0[1]));
          t0[1]._0_6_ = CONCAT15(0,CONCAT14(uStack_360._2_1_,(uint)t0[1]));
          t0[1] = CONCAT17(0,CONCAT16(uStack_360._3_1_,(uint6)t0[1]));
          lVar22 = t0[1];
          s1[0]._0_1_ = uStack_360._4_1_;
          s1[0]._1_1_ = 0;
          s1[0]._2_1_ = uStack_360._5_1_;
          s1[0]._3_1_ = 0;
          s1[0]._4_1_ = uStack_360._6_1_;
          s1[0]._5_1_ = 0;
          s1[0]._6_1_ = uStack_360._7_1_;
          auVar33 = pmovzxbw(auVar33,s1[1]);
          local_358 = m1[1];
          lStack_350 = m0[0];
          local_348._0_2_ = (short)compositor._p32[1];
          local_348._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
          local_348._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
          local_348._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
          uStack_340._0_2_ = (short)compositor._u32[0];
          uStack_340._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
          uStack_340._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
          uStack_340._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
          t1[1]._0_4_ = CONCAT22(local_348._2_2_ * uVar31,(short)local_348 * uVar31);
          t1[1] = CONCAT26(local_348._6_2_ * uVar31,CONCAT24(local_348._4_2_ * uVar31,(int)t1[1]));
          t0[0]._0_4_ = CONCAT22(uStack_340._2_2_ * uVar35,(short)uStack_340 * uVar35);
          t0[0] = CONCAT26(uStack_340._6_2_ * uVar35,CONCAT24(uStack_340._4_2_ * uVar35,(int)t0[0]))
          ;
          local_328 = compositor._p32[1];
          lStack_320 = compositor._u32[0];
          lStack_330 = m1[0];
          local_288 = m1[1];
          lStack_280 = m0[0];
          local_298 = 0xff00ff00ff00ff;
          uStack_290 = 0xff00ff00ff00ff;
          uVar32 = m1[1] ^ 0xff00ff00ff00ff;
          uVar40 = m0[0] ^ 0xff00ff00ff00ff;
          local_268 = local_338;
          lStack_260 = m1[0];
          local_278 = 0xff00ff00ff00ff;
          uStack_270 = 0xff00ff00ff00ff;
          s0[1] = local_338 ^ 0xff00ff00ff00ff;
          m1[0] = m1[0] ^ 0xff00ff00ff00ff;
          s1[1] = auVar33._0_8_;
          lVar9 = s1[1];
          s0[0] = auVar33._8_8_;
          lVar10 = s0[0];
          local_308._0_2_ = auVar33._0_2_;
          local_308._2_2_ = auVar33._2_2_;
          local_308._4_2_ = auVar33._4_2_;
          local_308._6_2_ = auVar33._6_2_;
          uStack_300._0_2_ = auVar33._8_2_;
          uStack_300._2_2_ = auVar33._10_2_;
          uStack_300._4_2_ = auVar33._12_2_;
          uStack_300._6_2_ = auVar33._14_2_;
          local_318._0_2_ = (short)uVar32;
          local_318._2_2_ = (short)(uVar32 >> 0x10);
          local_318._4_2_ = (short)(uVar32 >> 0x20);
          local_318._6_2_ = (short)(uVar32 >> 0x30);
          uStack_310._0_2_ = (short)uVar40;
          uStack_310._2_2_ = (short)(uVar40 >> 0x10);
          uStack_310._4_2_ = (short)(uVar40 >> 0x20);
          uStack_310._6_2_ = (short)(uVar40 >> 0x30);
          s1[1]._0_4_ = CONCAT22(local_308._2_2_ * local_318._2_2_,
                                 (short)local_308 * (short)local_318);
          s1[1]._0_6_ = CONCAT24(local_308._4_2_ * local_318._4_2_,(undefined4)s1[1]);
          s1[1] = CONCAT26(local_308._6_2_ * local_318._6_2_,(undefined6)s1[1]);
          s0[0]._0_2_ = (short)uStack_300 * (short)uStack_310;
          s0[0]._2_2_ = uStack_300._2_2_ * uStack_310._2_2_;
          s0[0]._4_2_ = uStack_300._4_2_ * uStack_310._4_2_;
          s0[0]._6_2_ = uStack_300._6_2_ * uStack_310._6_2_;
          s1[0] = (longlong)(uint7)t0[2];
          lVar11 = s1[0];
          local_2e8._2_2_ = (ushort)uStack_360._1_1_;
          local_2e8._4_2_ = (ushort)uStack_360._2_1_;
          local_2e8._6_2_ = (ushort)uStack_360._3_1_;
          uStack_2e0._0_2_ = (ushort)uStack_360._4_1_;
          uStack_2e0._2_2_ = (ushort)uStack_360._5_1_;
          uStack_2e0._4_2_ = (ushort)uStack_360._6_1_;
          uStack_2e0._6_2_ = (ushort)uStack_360._7_1_;
          local_2f8._0_2_ = (short)s0[1];
          local_2f8._2_2_ = (short)((ulong)s0[1] >> 0x10);
          local_2f8._4_2_ = (short)((ulong)s0[1] >> 0x20);
          local_2f8._6_2_ = (short)((ulong)s0[1] >> 0x30);
          uStack_2f0._0_2_ = (short)m1[0];
          uStack_2f0._2_2_ = (short)((ulong)m1[0] >> 0x10);
          uStack_2f0._4_2_ = (short)((ulong)m1[0] >> 0x20);
          uStack_2f0._6_2_ = (short)((ulong)m1[0] >> 0x30);
          local_2f8._0_2_ = (ushort)t0[1] * (short)local_2f8;
          t0[1]._0_4_ = CONCAT22(local_2e8._2_2_ * local_2f8._2_2_,(short)local_2f8);
          t0[1]._0_6_ = CONCAT24(local_2e8._4_2_ * local_2f8._4_2_,(uint)t0[1]);
          t0[1] = CONCAT26(local_2e8._6_2_ * local_2f8._6_2_,(uint6)t0[1]);
          s1[0]._0_2_ = (ushort)uStack_2e0 * (short)uStack_2f0;
          s1[0]._2_2_ = uStack_2e0._2_2_ * uStack_2f0._2_2_;
          s1[0]._4_2_ = uStack_2e0._4_2_ * uStack_2f0._4_2_;
          s1[0]._6_2_ = uStack_2e0._6_2_ * uStack_2f0._6_2_;
          local_1c8 = s1[1];
          lStack_1c0 = s0[0];
          local_1d8 = t1[1];
          lStack_1d0 = t0[0];
          local_708 = (short)local_308 * (short)local_318 + (short)local_348 * uVar31;
          sStack_706 = local_308._2_2_ * local_318._2_2_ + local_348._2_2_ * uVar31;
          sStack_704 = local_308._4_2_ * local_318._4_2_ + local_348._4_2_ * uVar31;
          sStack_702 = local_308._6_2_ * local_318._6_2_ + local_348._6_2_ * uVar31;
          sStack_700 = (short)uStack_300 * (short)uStack_310 + (short)uStack_340 * uVar35;
          sStack_6fe = uStack_300._2_2_ * uStack_310._2_2_ + uStack_340._2_2_ * uVar35;
          sStack_6fc = uStack_300._4_2_ * uStack_310._4_2_ + uStack_340._4_2_ * uVar35;
          sStack_6fa = uStack_300._6_2_ * uStack_310._6_2_ + uStack_340._6_2_ * uVar35;
          s1[1]._0_4_ = CONCAT22(sStack_706,local_708);
          s1[1]._0_6_ = CONCAT24(sStack_704,(undefined4)s1[1]);
          s1[1] = CONCAT26(sStack_702,(undefined6)s1[1]);
          s0[0]._0_2_ = sStack_700;
          s0[0]._2_2_ = sStack_6fe;
          s0[0]._4_2_ = sStack_6fc;
          s0[0]._6_2_ = sStack_6fa;
          local_1a8 = t0[1];
          lStack_1a0 = s1[0];
          local_1b8 = CONCAT26(local_348._6_2_ * uVar36,
                               CONCAT24(local_348._4_2_ * uVar36,
                                        CONCAT22(local_348._2_2_ * uVar36,(short)local_348 * uVar36)
                                       ));
          uStack_1b0 = CONCAT26(uStack_340._6_2_ * uVar38,
                                CONCAT24(uStack_340._4_2_ * uVar38,
                                         CONCAT22(uStack_340._2_2_ * uVar38,
                                                  (short)uStack_340 * uVar38)));
          local_2f8._0_2_ = (short)local_2f8 + (short)local_348 * uVar36;
          sStack_736 = local_2e8._2_2_ * local_2f8._2_2_ + local_348._2_2_ * uVar36;
          sStack_734 = local_2e8._4_2_ * local_2f8._4_2_ + local_348._4_2_ * uVar36;
          sStack_732 = local_2e8._6_2_ * local_2f8._6_2_ + local_348._6_2_ * uVar36;
          sStack_730 = (ushort)uStack_2e0 * (short)uStack_2f0 + (short)uStack_340 * uVar38;
          sStack_72e = uStack_2e0._2_2_ * uStack_2f0._2_2_ + uStack_340._2_2_ * uVar38;
          sStack_72c = uStack_2e0._4_2_ * uStack_2f0._4_2_ + uStack_340._4_2_ * uVar38;
          sStack_72a = uStack_2e0._6_2_ * uStack_2f0._6_2_ + uStack_340._6_2_ * uVar38;
          t0[1]._0_4_ = CONCAT22(sStack_736,(short)local_2f8);
          t0[1]._0_6_ = CONCAT24(sStack_734,(uint)t0[1]);
          t0[1] = CONCAT26(sStack_732,(uint6)t0[1]);
          s1[0]._0_2_ = sStack_730;
          s1[0]._2_2_ = sStack_72e;
          s1[0]._4_2_ = sStack_72c;
          s1[0]._6_2_ = sStack_72a;
          local_6f8 = s1 + 1;
          local_6f0 = SIMD::(anonymous_namespace)::u16_0080_128;
          local_228 = s1[1];
          lStack_220 = s0[0];
          local_238 = 0x80008000800080;
          uStack_230 = 0x80008000800080;
          local_708 = local_708 + 0x80;
          sStack_706 = sStack_706 + 0x80;
          sStack_704 = sStack_704 + 0x80;
          sStack_702 = sStack_702 + 0x80;
          sStack_700 = sStack_700 + 0x80;
          sStack_6fe = sStack_6fe + 0x80;
          sStack_6fc = sStack_6fc + 0x80;
          sStack_6fa = sStack_6fa + 0x80;
          local_170 = &local_708;
          local_178 = SIMD::(anonymous_namespace)::u16_0101_128;
          local_f8 = CONCAT26(sStack_702,CONCAT24(sStack_704,CONCAT22(sStack_706,local_708)));
          uStack_f0 = CONCAT26(sStack_6fa,CONCAT24(sStack_6fc,CONCAT22(sStack_6fe,sStack_700)));
          auVar18._2_2_ = sStack_706;
          auVar18._0_2_ = local_708;
          auVar18._4_2_ = sStack_704;
          auVar18._6_2_ = sStack_702;
          auVar18._8_2_ = sStack_700;
          auVar18._10_2_ = sStack_6fe;
          auVar18._12_2_ = sStack_6fc;
          auVar18._14_2_ = sStack_6fa;
          local_108 = 0x101010101010101;
          uStack_100 = 0x101010101010101;
          auVar34._8_8_ = 0x101010101010101;
          auVar34._0_8_ = 0x101010101010101;
          auVar34 = pmulhuw(auVar18,auVar34);
          local_720 = t0 + 1;
          local_718 = SIMD::(anonymous_namespace)::u16_0080_128;
          local_208 = t0[1];
          lStack_200 = s1[0];
          local_218 = 0x80008000800080;
          uStack_210 = 0x80008000800080;
          local_738 = (short)local_2f8 + 0x80;
          sStack_736 = sStack_736 + 0x80;
          sStack_734 = sStack_734 + 0x80;
          sStack_732 = sStack_732 + 0x80;
          sStack_730 = sStack_730 + 0x80;
          sStack_72e = sStack_72e + 0x80;
          sStack_72c = sStack_72c + 0x80;
          sStack_72a = sStack_72a + 0x80;
          local_160 = &local_738;
          local_168 = SIMD::(anonymous_namespace)::u16_0101_128;
          local_118 = CONCAT26(sStack_732,CONCAT24(sStack_734,CONCAT22(sStack_736,local_738)));
          uStack_110 = CONCAT26(sStack_72a,CONCAT24(sStack_72c,CONCAT22(sStack_72e,sStack_730)));
          auVar17._2_2_ = sStack_736;
          auVar17._0_2_ = local_738;
          auVar17._4_2_ = sStack_734;
          auVar17._6_2_ = sStack_732;
          auVar17._8_2_ = sStack_730;
          auVar17._10_2_ = sStack_72e;
          auVar17._12_2_ = sStack_72c;
          auVar17._14_2_ = sStack_72a;
          local_128 = 0x101010101010101;
          uStack_120 = 0x101010101010101;
          auVar33._8_8_ = 0x101010101010101;
          auVar33._0_8_ = 0x101010101010101;
          register0x00001200 = pmulhuw(auVar17,auVar33);
          local_6c8 = s1 + 1;
          local_6d0 = t0 + 1;
          s1[1] = auVar34._0_8_;
          lVar12 = s1[1];
          s0[0] = auVar34._8_8_;
          lVar13 = s0[0];
          local_d8._0_2_ = auVar34._0_2_;
          local_d8._2_2_ = auVar34._2_2_;
          local_d8._4_2_ = auVar34._4_2_;
          local_d8._6_2_ = auVar34._6_2_;
          uStack_d0._0_2_ = auVar34._8_2_;
          uStack_d0._2_2_ = auVar34._10_2_;
          uStack_d0._4_2_ = auVar34._12_2_;
          uStack_d0._6_2_ = auVar34._14_2_;
          local_e8._0_2_ = (short)t0[1];
          local_e8._2_2_ = t0[1]._2_2_;
          local_e8._4_2_ = t0[1]._4_2_;
          local_e8._6_2_ = t0[1]._6_2_;
          uStack_e0._0_2_ = (short)t0[2];
          uStack_e0._2_2_ = t0[2]._2_2_;
          uStack_e0._4_2_ = t0[2]._4_2_;
          uStack_e0._6_2_ = t0[2]._6_2_;
          s1[1]._0_4_ = CONCAT13((0 < local_d8._6_2_) * (local_d8._6_2_ < 0x100) * auVar34[6] -
                                 (0xff < local_d8._6_2_),
                                 CONCAT12((0 < local_d8._4_2_) * (local_d8._4_2_ < 0x100) *
                                          auVar34[4] - (0xff < local_d8._4_2_),
                                          CONCAT11((0 < local_d8._2_2_) * (local_d8._2_2_ < 0x100) *
                                                   auVar34[2] - (0xff < local_d8._2_2_),
                                                   (0 < (short)local_d8) * ((short)local_d8 < 0x100)
                                                   * auVar34[0] - (0xff < (short)local_d8))));
          s1[1]._0_6_ = CONCAT15((0 < uStack_d0._2_2_) * (uStack_d0._2_2_ < 0x100) * auVar34[10] -
                                 (0xff < uStack_d0._2_2_),
                                 CONCAT14((0 < (short)uStack_d0) * ((short)uStack_d0 < 0x100) *
                                          auVar34[8] - (0xff < (short)uStack_d0),(undefined4)s1[1]))
          ;
          s1[1] = CONCAT17((0 < uStack_d0._6_2_) * (uStack_d0._6_2_ < 0x100) * auVar34[0xe] -
                           (0xff < uStack_d0._6_2_),
                           CONCAT16((0 < uStack_d0._4_2_) * (uStack_d0._4_2_ < 0x100) * auVar34[0xc]
                                    - (0xff < uStack_d0._4_2_),(undefined6)s1[1]));
          s0[0]._0_1_ = (0 < (short)local_e8) * ((short)local_e8 < 0x100) * (char)t0[1] -
                        (0xff < (short)local_e8);
          s0[0]._1_1_ = (0 < local_e8._2_2_) * (local_e8._2_2_ < 0x100) * t0[1]._2_1_ -
                        (0xff < local_e8._2_2_);
          s0[0]._2_1_ = (0 < local_e8._4_2_) * (local_e8._4_2_ < 0x100) * t0[1]._4_1_ -
                        (0xff < local_e8._4_2_);
          s0[0]._3_1_ = (0 < local_e8._6_2_) * (local_e8._6_2_ < 0x100) * t0[1]._6_1_ -
                        (0xff < local_e8._6_2_);
          s0[0]._4_1_ = (0 < (short)uStack_e0) * ((short)uStack_e0 < 0x100) * (char)t0[2] -
                        (0xff < (short)uStack_e0);
          s0[0]._5_1_ = (0 < uStack_e0._2_2_) * (uStack_e0._2_2_ < 0x100) * t0[2]._2_1_ -
                        (0xff < uStack_e0._2_2_);
          s0[0]._6_1_ = (0 < uStack_e0._4_2_) * (uStack_e0._4_2_ < 0x100) * t0[2]._4_1_ -
                        (0xff < uStack_e0._4_2_);
          s0[0]._7_1_ = (0 < uStack_e0._6_2_) * (uStack_e0._6_2_ < 0x100) * t0[2]._6_1_ -
                        (0xff < uStack_e0._6_2_);
          local_4d8 = &cell->cover + local_a30;
          local_4e8 = s1[1];
          lStack_4e0 = s0[0];
          *(longlong *)local_4d8 = s1[1];
          *(longlong *)(local_4d8 + 2) = s0[0];
          local_a30 = local_a30 + 4;
          local_710 = local_720;
          local_6e8 = local_6f8;
          local_578 = sVar2;
          uStack_570 = lVar3;
          local_4c8 = lVar23;
          local_478 = lVar4;
          uStack_470 = lVar5;
          local_408 = local_418;
          uStack_400 = uStack_410;
          local_3d8 = lVar4;
          uStack_3d0 = lVar5;
          local_3c8 = lVar6;
          uStack_3c0 = lVar7;
          uStack_360 = lVar8;
          local_348 = compositor._p32[1];
          uStack_340 = compositor._u32[0];
          local_318 = uVar32;
          uStack_310 = uVar40;
          local_308 = lVar9;
          uStack_300 = lVar10;
          local_2f8 = s0[1];
          uStack_2f0 = m1[0];
          local_2e8 = lVar22;
          uStack_2e0 = lVar11;
          local_e8 = t0[1];
          uStack_e0 = s1[0];
          local_d8 = lVar12;
          uStack_d0 = lVar13;
        }
      }
      for (; sVar2 = local_558, local_558._0_4_ = (int)i, local_a30 < uVar30;
          local_a30 = local_a30 + 1) {
        local_680 = pCVar19 + local_a30;
        local_664 = local_680->cover;
        local_678._4_4_ = 0;
        local_678._0_4_ = local_664;
        uStack_af8 = local_678._0_8_;
        t0_1[0] = 0;
        local_6a0 = &pCVar19[local_a30].area;
        local_684 = *local_6a0;
        local_698 = ZEXT416(local_684);
        stack0xfffffffffffff528 = ZEXT416(local_684);
        sVar2 = i;
        lStack_550 = coverXmm[0];
        local_568 = local_678._0_8_;
        uStack_560 = 0;
        local_558._4_4_ = (undefined4)(i >> 0x20);
        i = CONCAT44(local_558._4_4_,(int)local_558 + local_664);
        local_678 = ZEXT416(local_664);
        local_558 = sVar2;
        Cell::reset(pCVar19 + local_a30);
        lVar3 = s0_1[1];
        lVar4 = m0_1[0];
        local_4ac = 9;
        local_4a8._0_4_ = (int)s0_1[1];
        local_4a8._4_4_ = s0_1[1]._4_4_;
        uStack_4a0._0_4_ = (int)s0_1[2];
        uStack_4a0._4_4_ = s0_1[2]._4_4_;
        auVar33 = ZEXT416(9);
        s0_1[1] = CONCAT44(local_4a8._4_4_ >> auVar33,(int)local_4a8 >> auVar33);
        m0_1[0]._0_4_ = (int)uStack_4a0 >> auVar33;
        m0_1[0]._4_4_ = uStack_4a0._4_4_ >> auVar33;
        local_458 = s0_1[1];
        lStack_450 = m0_1[0];
        local_448._0_4_ = (int)i;
        local_448._4_4_ = (int)(i >> 0x20);
        uStack_440._0_4_ = (int)coverXmm[0];
        uStack_440._4_4_ = (int)((ulong)coverXmm[0] >> 0x20);
        s0_1[1] = CONCAT44(local_448._4_4_ - (local_4a8._4_4_ >> auVar33),
                           (int)local_448 - ((int)local_4a8 >> auVar33));
        m0_1[0]._0_4_ = (int)uStack_440 - ((int)uStack_4a0 >> auVar33);
        m0_1[0]._4_4_ = uStack_440._4_4_ - (uStack_4a0._4_4_ >> auVar33);
        local_50 = s0_1 + 1;
        local_58 = CompositorSIMD::
                   vmask<false>(unsigned_int*,unsigned_long,unsigned_long,Cell*,int&)::u32_01FF_128;
        local_38 = s0_1[1];
        lStack_30 = m0_1[0];
        local_48 = 0x1ff000001ff;
        uStack_40 = 0x1ff000001ff;
        local_3f8 = s0_1[1] & 0x1ff000001ff;
        uStack_3f0 = m0_1[0] & 0x1ff000001ff;
        m0_1[0] = uStack_3f0;
        s0_1[1] = local_3f8;
        local_660 = s0_1 + 1;
        auVar33 = packssdw(stack0xfffffffffffff528,stack0xfffffffffffff528);
        local_428 = 0x1ff000001ff;
        uStack_420 = 0x1ff000001ff;
        s0_1[1] = auVar33._0_8_;
        lVar5 = s0_1[1];
        m0_1[0] = auVar33._8_8_;
        lVar6 = m0_1[0];
        local_438._0_4_ = auVar33._0_4_;
        local_438._4_4_ = auVar33._4_4_;
        uStack_430._0_4_ = auVar33._8_4_;
        uStack_430._4_4_ = auVar33._12_4_;
        local_438._0_4_ = 0x1ff - (int)local_438;
        local_438._4_4_ = 0x1ff - local_438._4_4_;
        uStack_430._0_4_ = 0x1ff - (int)uStack_430;
        uStack_430._4_4_ = 0x1ff - uStack_430._4_4_;
        uStack_af8 = CONCAT44(local_438._4_4_,(int)local_438);
        t0_1[0] = CONCAT44(uStack_430._4_4_,(int)uStack_430);
        uVar14 = uStack_af8;
        lVar7 = t0_1[0];
        local_3a8._0_2_ = auVar33._0_2_;
        local_3a8._2_2_ = auVar33._2_2_;
        local_3a8._4_2_ = auVar33._4_2_;
        local_3a8._6_2_ = auVar33._6_2_;
        uStack_3a0._0_2_ = auVar33._8_2_;
        uStack_3a0._2_2_ = auVar33._10_2_;
        uStack_3a0._4_2_ = auVar33._12_2_;
        uStack_3a0._6_2_ = auVar33._14_2_;
        local_3b8._0_2_ = (short)(int)local_438;
        local_3b8._2_2_ = (short)((uint)(int)local_438 >> 0x10);
        local_3b8._4_2_ = (short)local_438._4_4_;
        local_3b8._6_2_ = (short)((uint)local_438._4_4_ >> 0x10);
        uStack_3b0._0_2_ = (short)(int)uStack_430;
        uStack_3b0._2_2_ = (short)((uint)(int)uStack_430 >> 0x10);
        uStack_3b0._4_2_ = (short)uStack_430._4_4_;
        uStack_3b0._6_2_ = (short)((uint)uStack_430._4_4_ >> 0x10);
        s0_1[1] = CONCAT26((ushort)(local_3b8._6_2_ < local_3a8._6_2_) * local_3b8._6_2_ |
                           (ushort)(local_3b8._6_2_ >= local_3a8._6_2_) * local_3a8._6_2_,
                           CONCAT24((ushort)(local_3b8._4_2_ < local_3a8._4_2_) * local_3b8._4_2_ |
                                    (ushort)(local_3b8._4_2_ >= local_3a8._4_2_) * local_3a8._4_2_,
                                    CONCAT22((ushort)(local_3b8._2_2_ < local_3a8._2_2_) *
                                             local_3b8._2_2_ |
                                             (ushort)(local_3b8._2_2_ >= local_3a8._2_2_) *
                                             local_3a8._2_2_,
                                             (ushort)((short)local_3b8 < (short)local_3a8) *
                                             (short)local_3b8 |
                                             (ushort)((short)local_3b8 >= (short)local_3a8) *
                                             (short)local_3a8)));
        m0_1[0]._0_2_ =
             (ushort)((short)uStack_3b0 < (short)uStack_3a0) * (short)uStack_3b0 |
             (ushort)((short)uStack_3b0 >= (short)uStack_3a0) * (short)uStack_3a0;
        m0_1[0]._2_2_ =
             (ushort)(uStack_3b0._2_2_ < uStack_3a0._2_2_) * uStack_3b0._2_2_ |
             (ushort)(uStack_3b0._2_2_ >= uStack_3a0._2_2_) * uStack_3a0._2_2_;
        m0_1[0]._4_2_ =
             (ushort)(uStack_3b0._4_2_ < uStack_3a0._4_2_) * uStack_3b0._4_2_ |
             (ushort)(uStack_3b0._4_2_ >= uStack_3a0._4_2_) * uStack_3a0._4_2_;
        m0_1[0]._6_2_ =
             (ushort)(uStack_3b0._6_2_ < uStack_3a0._6_2_) * uStack_3b0._6_2_ |
             (ushort)(uStack_3b0._6_2_ >= uStack_3a0._6_2_) * uStack_3a0._6_2_;
        local_6c0 = &pCVar20->cover + local_a30;
        local_6a4 = *local_6c0;
        local_6b8 = ZEXT416(local_6a4);
        stack0xfffffffffffff518 = ZEXT416(local_6a4);
        auVar33 = pshuflw(stack0xfffffffffffff528,stack0xfffffffffffff528,0);
        local_750 = t0_1 + 1;
        local_9c8 = (ulong)local_6a4;
        auVar34 = pmovzxbw(stack0xfffffffffffff518,local_9c8);
        s0_1[1] = auVar33._0_8_;
        lVar8 = s0_1[1];
        m0_1[0] = auVar33._8_8_;
        lVar9 = m0_1[0];
        local_2c8._0_2_ = auVar33._0_2_;
        local_2c8._2_2_ = auVar33._2_2_;
        local_2c8._4_2_ = auVar33._4_2_;
        local_2c8._6_2_ = auVar33._6_2_;
        uStack_2c0._0_2_ = auVar33._8_2_;
        uStack_2c0._2_2_ = auVar33._10_2_;
        uStack_2c0._4_2_ = auVar33._12_2_;
        uStack_2c0._6_2_ = auVar33._14_2_;
        local_2d8._0_2_ = (short)compositor._p32[1];
        local_2d8._2_2_ = (short)((ulong)compositor._p32[1] >> 0x10);
        local_2d8._4_2_ = (short)((ulong)compositor._p32[1] >> 0x20);
        local_2d8._6_2_ = (short)((ulong)compositor._p32[1] >> 0x30);
        uStack_2d0._0_2_ = (short)compositor._u32[0];
        uStack_2d0._2_2_ = (short)((ulong)compositor._u32[0] >> 0x10);
        uStack_2d0._4_2_ = (short)((ulong)compositor._u32[0] >> 0x20);
        uStack_2d0._6_2_ = (short)((ulong)compositor._u32[0] >> 0x30);
        uStack_af8 = CONCAT26(local_2c8._6_2_ * local_2d8._6_2_,
                              CONCAT24(local_2c8._4_2_ * local_2d8._4_2_,
                                       CONCAT22(local_2c8._2_2_ * local_2d8._2_2_,
                                                (short)local_2c8 * (short)local_2d8)));
        t0_1[0] = CONCAT26(uStack_2c0._6_2_ * uStack_2d0._6_2_,
                           CONCAT24(uStack_2c0._4_2_ * uStack_2d0._4_2_,
                                    CONCAT22(uStack_2c0._2_2_ * uStack_2d0._2_2_,
                                             (short)uStack_2c0 * (short)uStack_2d0)));
        local_248 = s0_1[1];
        lStack_240 = m0_1[0];
        local_258 = 0xff00ff00ff00ff;
        uStack_250 = 0xff00ff00ff00ff;
        s0_1[1] = s0_1[1] ^ 0xff00ff00ff00ff;
        m0_1[0] = m0_1[0] ^ 0xff00ff00ff00ff;
        t0_1[1] = auVar34._0_8_;
        lVar10 = t0_1[1];
        s0_1[0] = auVar34._8_8_;
        lVar11 = s0_1[0];
        local_2a8._0_2_ = auVar34._0_2_;
        local_2a8._2_2_ = auVar34._2_2_;
        local_2a8._4_2_ = auVar34._4_2_;
        local_2a8._6_2_ = auVar34._6_2_;
        uStack_2a0._0_2_ = auVar34._8_2_;
        uStack_2a0._2_2_ = auVar34._10_2_;
        uStack_2a0._4_2_ = auVar34._12_2_;
        uStack_2a0._6_2_ = auVar34._14_2_;
        local_2b8._0_2_ = (short)s0_1[1];
        local_2b8._2_2_ = (short)((ulong)s0_1[1] >> 0x10);
        local_2b8._4_2_ = (short)((ulong)s0_1[1] >> 0x20);
        local_2b8._6_2_ = (short)((ulong)s0_1[1] >> 0x30);
        uStack_2b0._0_2_ = (short)m0_1[0];
        uStack_2b0._2_2_ = (short)((ulong)m0_1[0] >> 0x10);
        uStack_2b0._4_2_ = (short)((ulong)m0_1[0] >> 0x20);
        uStack_2b0._6_2_ = (short)((ulong)m0_1[0] >> 0x30);
        t0_1[1]._0_4_ =
             CONCAT22(local_2a8._2_2_ * local_2b8._2_2_,(short)local_2a8 * (short)local_2b8);
        t0_1[1]._0_6_ = CONCAT24(local_2a8._4_2_ * local_2b8._4_2_,(int32_t)t0_1[1]);
        t0_1[1] = CONCAT26(local_2a8._6_2_ * local_2b8._6_2_,(undefined6)t0_1[1]);
        s0_1[0]._0_2_ = (short)uStack_2a0 * (short)uStack_2b0;
        s0_1[0]._2_2_ = uStack_2a0._2_2_ * uStack_2b0._2_2_;
        s0_1[0]._4_2_ = uStack_2a0._4_2_ * uStack_2b0._4_2_;
        s0_1[0]._6_2_ = uStack_2a0._6_2_ * uStack_2b0._6_2_;
        local_188 = t0_1[1];
        lStack_180 = s0_1[0];
        local_198 = uStack_af8;
        lStack_190 = t0_1[0];
        local_768 = (short)local_2a8 * (short)local_2b8 + (short)local_2c8 * (short)local_2d8;
        sStack_766 = local_2a8._2_2_ * local_2b8._2_2_ + local_2c8._2_2_ * local_2d8._2_2_;
        sStack_764 = local_2a8._4_2_ * local_2b8._4_2_ + local_2c8._4_2_ * local_2d8._4_2_;
        sStack_762 = local_2a8._6_2_ * local_2b8._6_2_ + local_2c8._6_2_ * local_2d8._6_2_;
        sStack_760 = (short)uStack_2a0 * (short)uStack_2b0 + (short)uStack_2c0 * (short)uStack_2d0;
        sStack_75e = uStack_2a0._2_2_ * uStack_2b0._2_2_ + uStack_2c0._2_2_ * uStack_2d0._2_2_;
        sStack_75c = uStack_2a0._4_2_ * uStack_2b0._4_2_ + uStack_2c0._4_2_ * uStack_2d0._4_2_;
        sStack_75a = uStack_2a0._6_2_ * uStack_2b0._6_2_ + uStack_2c0._6_2_ * uStack_2d0._6_2_;
        t0_1[1]._0_4_ = CONCAT22(sStack_766,local_768);
        t0_1[1]._0_6_ = CONCAT24(sStack_764,(int32_t)t0_1[1]);
        t0_1[1] = CONCAT26(sStack_762,(undefined6)t0_1[1]);
        s0_1[0]._0_2_ = sStack_760;
        s0_1[0]._2_2_ = sStack_75e;
        s0_1[0]._4_2_ = sStack_75c;
        s0_1[0]._6_2_ = sStack_75a;
        local_748 = SIMD::(anonymous_namespace)::u16_0080_128;
        local_1e8 = t0_1[1];
        lStack_1e0 = s0_1[0];
        local_1f8 = 0x80008000800080;
        uStack_1f0 = 0x80008000800080;
        local_768 = local_768 + 0x80;
        sStack_766 = sStack_766 + 0x80;
        sStack_764 = sStack_764 + 0x80;
        sStack_762 = sStack_762 + 0x80;
        sStack_760 = sStack_760 + 0x80;
        sStack_75e = sStack_75e + 0x80;
        sStack_75c = sStack_75c + 0x80;
        sStack_75a = sStack_75a + 0x80;
        local_150 = &local_768;
        local_158 = SIMD::(anonymous_namespace)::u16_0101_128;
        local_138 = CONCAT26(sStack_762,CONCAT24(sStack_764,CONCAT22(sStack_766,local_768)));
        uStack_130 = CONCAT26(sStack_75a,CONCAT24(sStack_75c,CONCAT22(sStack_75e,sStack_760)));
        auVar16._2_2_ = sStack_766;
        auVar16._0_2_ = local_768;
        auVar16._4_2_ = sStack_764;
        auVar16._6_2_ = sStack_762;
        auVar16._8_2_ = sStack_760;
        auVar16._10_2_ = sStack_75e;
        auVar16._12_2_ = sStack_75c;
        auVar16._14_2_ = sStack_75a;
        local_148 = 0x101010101010101;
        uStack_140 = 0x101010101010101;
        auVar15._8_8_ = 0x101010101010101;
        auVar15._0_8_ = 0x101010101010101;
        auVar33 = pmulhuw(auVar16,auVar15);
        t0_1[1] = auVar33._0_8_;
        lVar12 = t0_1[1];
        s0_1[0] = auVar33._8_8_;
        lVar13 = s0_1[0];
        local_c8 = t0_1[1];
        lStack_c0 = s0_1[0];
        local_b8._0_2_ = auVar33._0_2_;
        local_b8._2_2_ = auVar33._2_2_;
        local_b8._4_2_ = auVar33._4_2_;
        local_b8._6_2_ = auVar33._6_2_;
        uStack_b0._0_2_ = auVar33._8_2_;
        uStack_b0._2_2_ = auVar33._10_2_;
        uStack_b0._4_2_ = auVar33._12_2_;
        uStack_b0._6_2_ = auVar33._14_2_;
        t0_1[1]._1_1_ =
             (0 < local_b8._2_2_) * (local_b8._2_2_ < 0x100) * auVar33[2] - (0xff < local_b8._2_2_);
        t0_1[1]._0_1_ =
             (0 < (short)local_b8) * ((short)local_b8 < 0x100) * auVar33[0] -
             (0xff < (short)local_b8);
        t0_1[1]._2_1_ =
             (0 < local_b8._4_2_) * (local_b8._4_2_ < 0x100) * auVar33[4] - (0xff < local_b8._4_2_);
        t0_1[1]._3_1_ =
             (0 < local_b8._6_2_) * (local_b8._6_2_ < 0x100) * auVar33[6] - (0xff < local_b8._6_2_);
        t0_1[1]._0_6_ =
             CONCAT15((0 < uStack_b0._2_2_) * (uStack_b0._2_2_ < 0x100) * auVar33[10] -
                      (0xff < uStack_b0._2_2_),
                      CONCAT14((0 < (short)uStack_b0) * ((short)uStack_b0 < 0x100) * auVar33[8] -
                               (0xff < (short)uStack_b0),(int32_t)t0_1[1]));
        t0_1[1] = CONCAT17((0 < uStack_b0._6_2_) * (uStack_b0._6_2_ < 0x100) * auVar33[0xe] -
                           (0xff < uStack_b0._6_2_),
                           CONCAT16((0 < uStack_b0._4_2_) * (uStack_b0._4_2_ < 0x100) * auVar33[0xc]
                                    - (0xff < uStack_b0._4_2_),(undefined6)t0_1[1]));
        s0_1[0]._0_1_ =
             (0 < (short)local_b8) * ((short)local_b8 < 0x100) * auVar33[0] -
             (0xff < (short)local_b8);
        s0_1[0]._1_1_ =
             (0 < local_b8._2_2_) * (local_b8._2_2_ < 0x100) * auVar33[2] - (0xff < local_b8._2_2_);
        s0_1[0]._2_1_ =
             (0 < local_b8._4_2_) * (local_b8._4_2_ < 0x100) * auVar33[4] - (0xff < local_b8._4_2_);
        s0_1[0]._3_1_ =
             (0 < local_b8._6_2_) * (local_b8._6_2_ < 0x100) * auVar33[6] - (0xff < local_b8._6_2_);
        s0_1[0]._4_1_ =
             (0 < (short)uStack_b0) * ((short)uStack_b0 < 0x100) * auVar33[8] -
             (0xff < (short)uStack_b0);
        s0_1[0]._5_1_ =
             (0 < uStack_b0._2_2_) * (uStack_b0._2_2_ < 0x100) * auVar33[10] -
             (0xff < uStack_b0._2_2_);
        s0_1[0]._6_1_ =
             (0 < uStack_b0._4_2_) * (uStack_b0._4_2_ < 0x100) * auVar33[0xc] -
             (0xff < uStack_b0._4_2_);
        s0_1[0]._7_1_ =
             (0 < uStack_b0._6_2_) * (uStack_b0._6_2_ < 0x100) * auVar33[0xe] -
             (0xff < uStack_b0._6_2_);
        local_650 = &pCVar20->cover + local_a30;
        local_88 = t0_1[1];
        lStack_80 = s0_1[0];
        *local_650 = (int32_t)t0_1[1];
        local_740 = local_750;
        local_6e0 = local_750;
        local_6d8 = local_750;
        local_658 = local_750;
        local_4a8 = lVar3;
        uStack_4a0 = lVar4;
        local_448 = i;
        uStack_440 = coverXmm[0];
        local_438 = lVar5;
        uStack_430 = lVar6;
        local_3e8 = local_3f8;
        uStack_3e0 = uStack_3f0;
        local_3b8 = uVar14;
        uStack_3b0 = lVar7;
        local_3a8 = lVar5;
        uStack_3a0 = lVar6;
        local_2d8 = compositor._p32[1];
        uStack_2d0 = compositor._u32[0];
        local_2c8 = lVar8;
        uStack_2c0 = lVar9;
        local_2b8 = s0_1[1];
        uStack_2b0 = m0_1[0];
        local_2a8 = lVar10;
        uStack_2a0 = lVar11;
        local_b8 = lVar12;
        uStack_b0 = lVar13;
        local_78 = local_88;
        lStack_70 = lStack_80;
      }
      local_648 = &i;
      local_a8 = i;
      lStack_a0 = coverXmm[0];
      local_98 = local_a8;
      lStack_90 = lStack_a0;
      *(int *)coverXmm[1] = (int)local_558;
      local_558 = sVar2;
    }
    compositor._u32[1] = iVar27 + compositor._u32[1];
  }
  Bounds::reset(&this->_yBounds);
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}